

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

string * __thiscall
re2::RE2::QuoteMeta_abi_cxx11_(string *__return_storage_ptr__,RE2 *this,StringPiece *unquoted)

{
  byte bVar1;
  size_t ii;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar2 = 0;
  do {
    if ((this->pattern_)._M_string_length <= uVar2) {
      return __return_storage_ptr__;
    }
    bVar1 = (this->pattern_)._M_dataplus._M_p[uVar2];
    if ((char)bVar1 < 'a') {
      if ('@' < (char)bVar1) {
        if (bVar1 != 0x5f && 0x5a < bVar1) goto LAB_001a8e45;
        goto LAB_001a8e56;
      }
      if ('/' < (char)bVar1) {
        if (0x39 < bVar1) goto LAB_001a8e45;
        goto LAB_001a8e56;
      }
      if ((char)bVar1 < '\0') goto LAB_001a8e56;
      if (bVar1 != 0) goto LAB_001a8e45;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if (0x7a < bVar1) {
LAB_001a8e45:
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
LAB_001a8e56:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

std::string RE2::QuoteMeta(const StringPiece& unquoted) {
  std::string result;
  result.reserve(unquoted.size() << 1);

  // Escape any ascii character not in [A-Za-z_0-9].
  //
  // Note that it's legal to escape a character even if it has no
  // special meaning in a regular expression -- so this function does
  // that.  (This also makes it identical to the perl function of the
  // same name except for the null-character special case;
  // see `perldoc -f quotemeta`.)
  for (size_t ii = 0; ii < unquoted.size(); ++ii) {
    // Note that using 'isalnum' here raises the benchmark time from
    // 32ns to 58ns:
    if ((unquoted[ii] < 'a' || unquoted[ii] > 'z') &&
        (unquoted[ii] < 'A' || unquoted[ii] > 'Z') &&
        (unquoted[ii] < '0' || unquoted[ii] > '9') &&
        unquoted[ii] != '_' &&
        // If this is the part of a UTF8 or Latin1 character, we need
        // to copy this byte without escaping.  Experimentally this is
        // what works correctly with the regexp library.
        !(unquoted[ii] & 128)) {
      if (unquoted[ii] == '\0') {  // Special handling for null chars.
        // Note that this special handling is not strictly required for RE2,
        // but this quoting is required for other regexp libraries such as
        // PCRE.
        // Can't use "\\0" since the next character might be a digit.
        result += "\\x00";
        continue;
      }
      result += '\\';
    }
    result += unquoted[ii];
  }

  return result;
}